

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int push_captures(MatchState *ms,char *s,char *e)

{
  int size;
  int iVar1;
  int iVar2;
  
  iVar1 = ms->level;
  size = 1;
  if (iVar1 != 0) {
    size = iVar1;
  }
  if (s == (char *)0x0) {
    size = iVar1;
  }
  luaL_checkstack(ms->L,size,"too many captures");
  iVar1 = 0;
  iVar2 = 0;
  if (0 < size) {
    iVar1 = 0;
    iVar2 = size;
  }
  for (; iVar2 != iVar1; iVar1 = iVar1 + 1) {
    push_onecapture(ms,iVar1,s,e);
  }
  return size;
}

Assistant:

static int push_captures(MatchState *ms, const char *s, const char *e)
{
  int i;
  int nlevels = (ms->level == 0 && s) ? 1 : ms->level;
  luaL_checkstack(ms->L, nlevels, "too many captures");
  for (i = 0; i < nlevels; i++)
    push_onecapture(ms, i, s, e);
  return nlevels;  /* number of strings pushed */
}